

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::InstanceNameSyntax::setChild
          (InstanceNameSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *this_00;
  long in_RSI;
  long in_RDI;
  Token TVar1;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_ffffffffffffffc8;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *this_01;
  undefined8 local_20;
  Info *local_18;
  
  this_01 = (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&stack0x00000008;
  if (in_RSI == 0) {
    TVar1 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffc8);
    local_20 = TVar1._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar1.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else {
    this_00 = TokenOrSyntax::node((TokenOrSyntax *)0x3a38aa);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>>(this_00);
    SyntaxList<slang::syntax::VariableDimensionSyntax>::operator=(this_01,in_stack_ffffffffffffffc8)
    ;
  }
  return;
}

Assistant:

void InstanceNameSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: dimensions = child.node()->as<SyntaxList<VariableDimensionSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}